

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Resolver.cpp
# Opt level: O2

void __thiscall ResolverThread::func(ResolverThread *this)

{
  _Head_base<2UL,_Liby::EventLoop_*,_false> this_00;
  _List_node_header *this_01;
  _Any_data local_178;
  code *local_168;
  code *pcStack_160;
  BlockingQueue<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Liby::EventLoop_*,_std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>_>_>
  *local_158;
  ResolverThread *local_150;
  list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_> eps;
  _List_node_header local_130;
  _Any_data local_118;
  size_t local_108;
  _List_node_base *p_Stack_100;
  __tuple_element_t<1UL,_tuple<basic_string<char>,_basic_string<char>,_EventLoop_*,_function<void_(list<Endpoint,_allocator<Endpoint>_>)>_>_>
  port;
  __tuple_element_t<3UL,_tuple<basic_string<char>,_basic_string<char>,_EventLoop_*,_function<void_(list<Endpoint,_allocator<Endpoint>_>)>_>_>
  handler;
  __tuple_element_t<0UL,_tuple<basic_string<char>,_basic_string<char>,_EventLoop_*,_function<void_(list<Endpoint,_allocator<Endpoint>_>)>_>_>
  name;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Liby::EventLoop_*,_std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>_>
  request;
  
  local_158 = &this->requests_;
  local_150 = this;
  while (((local_150->keep_running)._M_base._M_i & 1U) != 0) {
    Liby::
    BlockingQueue<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Liby::EventLoop_*,_std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>_>_>
    ::pop_wait((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Liby::EventLoop_*,_std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>_>
                *)&request.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Liby::EventLoop_*,_std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>_>
               ,local_158);
    std::__cxx11::string::string
              ((string *)&name,
               (string *)
               &request.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Liby::EventLoop_*,_std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
              );
    std::__cxx11::string::string
              ((string *)&port,
               (string *)
               &request.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Liby::EventLoop_*,_std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>_>
                .
                super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Liby::EventLoop_*,_std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>_>
                .
                super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
              );
    this_00 = request.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Liby::EventLoop_*,_std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>_>
              .
              super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Liby::EventLoop_*,_std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>_>
              .
              super__Tuple_impl<2UL,_Liby::EventLoop_*,_std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>_>
              .super__Head_base<2UL,_Liby::EventLoop_*,_false>;
    std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>::
    function(&handler,(function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>
                       *)&request.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Liby::EventLoop_*,_std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>_>
            );
    if (handler.super__Function_base._M_manager != (_Manager_type)0x0) {
      eps.super__List_base<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>._M_impl._M_node._M_size
           = 0;
      eps.super__List_base<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>._M_impl._M_node.
      super__List_node_base._M_next = (_List_node_base *)&eps;
      eps.super__List_base<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>._M_impl._M_node.
      super__List_node_base._M_prev = (_List_node_base *)&eps;
      Liby::Resolver::resolve
                ((list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_> *)&local_130,&name,&port);
      std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>::_M_move_assign
                (&eps,&local_130);
      std::__cxx11::_List_base<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>::_M_clear
                ((_List_base<Liby::Endpoint,_std::allocator<Liby::Endpoint>_> *)&local_130);
      std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>::list
                ((list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_> *)&local_130,&eps);
      std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>::
      function((function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>
                *)&local_118,&handler);
      local_168 = (code *)0x0;
      pcStack_160 = (code *)0x0;
      local_178._M_unused._M_object = (void *)0x0;
      local_178._8_8_ = 0;
      this_01 = (_List_node_header *)operator_new(0x38);
      std::__detail::_List_node_header::_List_node_header(this_01,&local_130);
      this_01[1].super__List_node_base._M_next = (_List_node_base *)0x0;
      this_01[1].super__List_node_base._M_prev = (_List_node_base *)0x0;
      this_01[1]._M_size = 0;
      this_01[2].super__List_node_base._M_next = p_Stack_100;
      if (local_108 != 0) {
        this_01[1].super__List_node_base._M_next = (_List_node_base *)local_118._M_unused._0_8_;
        this_01[1].super__List_node_base._M_prev = (_List_node_base *)local_118._8_8_;
        this_01[1]._M_size = local_108;
        local_108 = 0;
        p_Stack_100 = (_List_node_base *)0x0;
      }
      pcStack_160 = std::
                    _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Resolver.cpp:53:31)>
                    ::_M_invoke;
      local_168 = std::
                  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Resolver.cpp:53:31)>
                  ::_M_manager;
      local_178._M_unused._0_8_ = (undefined8)this_01;
      Liby::EventLoop::runEventHandler(this_00._M_head_impl,(BasicHandler *)&local_178);
      std::_Function_base::~_Function_base((_Function_base *)&local_178);
      func()::$_0::~__0((__0 *)&local_130);
      std::__cxx11::_List_base<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>::_M_clear
                ((_List_base<Liby::Endpoint,_std::allocator<Liby::Endpoint>_> *)&eps);
    }
    std::_Function_base::~_Function_base(&handler.super__Function_base);
    std::__cxx11::string::~string((string *)&port);
    std::__cxx11::string::~string((string *)&name);
    std::
    _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Liby::EventLoop_*,_std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>_>
    ::~_Tuple_impl(&request.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Liby::EventLoop_*,_std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>_>
                  );
  }
  return;
}

Assistant:

void ResolverThread::func() {
    while (keep_running) {
        auto request = requests_.pop_wait();
        auto name = std::get<0>(request);
        auto port = std::get<1>(request);
        auto loop = std::get<2>(request);
        auto handler = std::get<3>(request);

        if (!handler) {
            continue;
        }

        std::list<Endpoint> eps;

        try {
            eps = Resolver::resolve(name, port);
        } catch (const char *err) { debug("resolver error: %s", err); }

        loop->runEventHandler([eps, handler] { handler(eps); });
    }
}